

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoboKin_dns.c
# Opt level: O3

int func(N_Vector y,N_Vector f,void *user_data)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double *pdVar25;
  double *pdVar26;
  double dStack_20;
  
  pdVar25 = (double *)N_VGetArrayPointer();
  pdVar26 = (double *)N_VGetArrayPointer(f);
  dVar4 = *pdVar25;
  dVar5 = pdVar25[1];
  dVar6 = pdVar25[2];
  dVar7 = pdVar25[3];
  dVar8 = pdVar25[4];
  dVar9 = pdVar25[5];
  dVar10 = pdVar25[6];
  dVar11 = pdVar25[7];
  dVar2 = (pdVar25[8] + -1.0) - dVar4;
  dVar3 = (pdVar25[9] + -1.0) - dVar5;
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  dVar3 = pdVar25[0x10];
  dVar12 = pdVar25[0x11];
  dVar13 = pdVar25[0xc];
  dVar14 = pdVar25[0xd];
  dVar15 = pdVar25[0x14];
  dVar16 = pdVar25[0x15];
  dVar17 = pdVar25[0xe];
  dVar18 = pdVar25[0xf];
  dVar19 = pdVar25[0x16];
  dVar20 = pdVar25[0x17];
  dVar21 = pdVar25[10];
  dVar22 = pdVar25[0xb];
  dVar23 = pdVar25[0x12];
  dVar24 = pdVar25[0x13];
  *pdVar26 = dVar6 * dVar5 * -0.3578 +
             dVar4 * 0.004731 * dVar6 +
             dVar7 * -0.9338 + dVar5 * -0.001637 + dVar4 * -0.1238 + dVar10 + -0.3571;
  pdVar26[1] = dVar6 * dVar5 * 0.7623 +
               dVar4 * 0.2238 * dVar6 +
               dVar7 * -0.6734 + dVar5 * -0.07745 + dVar4 * 0.2638 + -dVar10 + -0.6022;
  dStack_20 = auVar1._8_8_;
  pdVar26[8] = dVar2;
  pdVar26[9] = dStack_20;
  pdVar26[0x10] = dVar3 + -1.0 + dVar4;
  pdVar26[0x11] = dVar12 + -1.0 + dVar5;
  pdVar26[2] = dVar9 * dVar11 + dVar4 * 0.3578 + dVar5 * 0.004731;
  pdVar26[10] = (dVar21 + -1.0) - dVar6;
  pdVar26[0xb] = (dVar22 + -1.0) - dVar7;
  pdVar26[0x12] = dVar23 + -1.0 + dVar6;
  pdVar26[0x13] = dVar24 + -1.0 + dVar7;
  pdVar26[3] = dVar4 * -0.7623 + dVar5 * 0.2238 + 0.3461;
  pdVar26[4] = dVar4 * dVar4 + dVar5 * dVar5 + -1.0;
  pdVar26[0xc] = (dVar13 + -1.0) - dVar8;
  pdVar26[0xd] = (dVar14 + -1.0) - dVar9;
  pdVar26[0x14] = dVar15 + -1.0 + dVar8;
  pdVar26[0x15] = dVar16 + -1.0 + dVar9;
  pdVar26[5] = dVar6 * dVar6 + dVar7 * dVar7 + -1.0;
  pdVar26[6] = dVar8 * dVar8 + dVar9 * dVar9 + -1.0;
  pdVar26[7] = dVar10 * dVar10 + dVar11 * dVar11 + -1.0;
  pdVar26[0xe] = (dVar17 + -1.0) - dVar10;
  pdVar26[0xf] = (dVar18 + -1.0) - dVar11;
  pdVar26[0x16] = dVar19 + -1.0 + dVar10;
  pdVar26[0x17] = dVar20 + -1.0 + dVar11;
  return 0;
}

Assistant:

static int func(N_Vector y, N_Vector f, void* user_data)
{
  sunrealtype *yd, *fd;

  sunrealtype x1, x2, x3, x4, x5, x6, x7, x8;
  sunrealtype l1, l2, l3, l4, l5, l6, l7, l8;
  sunrealtype u1, u2, u3, u4, u5, u6, u7, u8;

  sunrealtype eq1, eq2, eq3, eq4, eq5, eq6, eq7, eq8;
  sunrealtype lb1, lb2, lb3, lb4, lb5, lb6, lb7, lb8;
  sunrealtype ub1, ub2, ub3, ub4, ub5, ub6, ub7, ub8;

  yd = N_VGetArrayPointer(y);
  fd = N_VGetArrayPointer(f);

  x1 = yd[0];
  l1 = yd[8];
  u1 = yd[16];
  x2 = yd[1];
  l2 = yd[9];
  u2 = yd[17];
  x3 = yd[2];
  l3 = yd[10];
  u3 = yd[18];
  x4 = yd[3];
  l4 = yd[11];
  u4 = yd[19];
  x5 = yd[4];
  l5 = yd[12];
  u5 = yd[20];
  x6 = yd[5];
  l6 = yd[13];
  u6 = yd[21];
  x7 = yd[6];
  l7 = yd[14];
  u7 = yd[22];
  x8 = yd[7];
  l8 = yd[15];
  u8 = yd[23];

  /* Nonlinear equations */

  eq1 = -0.1238 * x1 + x7 - 0.001637 * x2 - 0.9338 * x4 + 0.004731 * x1 * x3 -
        0.3578 * x2 * x3 - 0.3571;
  eq2 = 0.2638 * x1 - x7 - 0.07745 * x2 - 0.6734 * x4 + 0.2238 * x1 * x3 +
        0.7623 * x2 * x3 - 0.6022;
  eq3 = 0.3578 * x1 + 0.004731 * x2 + x6 * x8;
  eq4 = -0.7623 * x1 + 0.2238 * x2 + 0.3461;
  eq5 = x1 * x1 + x2 * x2 - 1;
  eq6 = x3 * x3 + x4 * x4 - 1;
  eq7 = x5 * x5 + x6 * x6 - 1;
  eq8 = x7 * x7 + x8 * x8 - 1;

  /* Lower bounds ( l_i = 1 + x_i >= 0)*/

  lb1 = l1 - 1.0 - x1;
  lb2 = l2 - 1.0 - x2;
  lb3 = l3 - 1.0 - x3;
  lb4 = l4 - 1.0 - x4;
  lb5 = l5 - 1.0 - x5;
  lb6 = l6 - 1.0 - x6;
  lb7 = l7 - 1.0 - x7;
  lb8 = l8 - 1.0 - x8;

  /* Upper bounds ( u_i = 1 - x_i >= 0)*/

  ub1 = u1 - 1.0 + x1;
  ub2 = u2 - 1.0 + x2;
  ub3 = u3 - 1.0 + x3;
  ub4 = u4 - 1.0 + x4;
  ub5 = u5 - 1.0 + x5;
  ub6 = u6 - 1.0 + x6;
  ub7 = u7 - 1.0 + x7;
  ub8 = u8 - 1.0 + x8;

  fd[0]  = eq1;
  fd[8]  = lb1;
  fd[16] = ub1;
  fd[1]  = eq2;
  fd[9]  = lb2;
  fd[17] = ub2;
  fd[2]  = eq3;
  fd[10] = lb3;
  fd[18] = ub3;
  fd[3]  = eq4;
  fd[11] = lb4;
  fd[19] = ub4;
  fd[4]  = eq5;
  fd[12] = lb5;
  fd[20] = ub5;
  fd[5]  = eq6;
  fd[13] = lb6;
  fd[21] = ub6;
  fd[6]  = eq7;
  fd[14] = lb7;
  fd[22] = ub7;
  fd[7]  = eq8;
  fd[15] = lb8;
  fd[23] = ub8;

  return (0);
}